

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent indent)

{
  char cVar1;
  cmMakefile *mf;
  cmTest *pcVar2;
  pointer pbVar3;
  pointer pcVar4;
  size_type sVar5;
  bool bVar6;
  size_t sVar7;
  ostream *poVar8;
  WrapQuotes in_R8D;
  pointer pbVar9;
  size_type sVar10;
  pointer ppVar11;
  string_view str;
  string local_b8;
  string equalSigns;
  string exe;
  string *__range2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  this->TestGenerated = true;
  mf = this->Test->Makefile;
  std::__cxx11::string::string((string *)&equalSigns,(string *)&this->Test->Name);
  bVar6 = anon_unknown.dwarf_45ef41::needToQuoteTestName(mf,&equalSigns);
  std::__cxx11::string::~string((string *)&equalSigns);
  std::__cxx11::string::string((string *)&exe,(string *)&this->Test->Name);
  sVar7 = anon_unknown.dwarf_45ef41::countMaxConsecutiveEqualSigns(&exe);
  equalSigns._M_dataplus._M_p = (pointer)&equalSigns.field_2;
  std::__cxx11::string::_M_construct((ulong)&equalSigns,(char)sVar7 + '\x01');
  std::__cxx11::string::~string((string *)&exe);
  pcVar2 = this->Test;
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::ConvertToUnixSlashes(&exe);
  if (bVar6) {
    poVar8 = operator<<(fout,(cmScriptGeneratorIndent)indent.Level);
    poVar8 = std::operator<<(poVar8,"add_test([");
    poVar8 = std::operator<<(poVar8,(string *)&equalSigns);
    poVar8 = std::operator<<(poVar8,"[");
    std::__cxx11::string::string((string *)&local_b8,(string *)&this->Test->Name);
    poVar8 = std::operator<<(poVar8,(string *)&local_b8);
    poVar8 = std::operator<<(poVar8,"]");
    poVar8 = std::operator<<(poVar8,(string *)&equalSigns);
    poVar8 = std::operator<<(poVar8,"] \"");
    poVar8 = std::operator<<(poVar8,(string *)&exe);
    std::operator<<(poVar8,"\"");
  }
  else {
    poVar8 = operator<<(fout,(cmScriptGeneratorIndent)indent.Level);
    poVar8 = std::operator<<(poVar8,"add_test(");
    std::__cxx11::string::string((string *)&local_b8,(string *)&this->Test->Name);
    poVar8 = std::operator<<(poVar8,(string *)&local_b8);
    poVar8 = std::operator<<(poVar8," \"");
    poVar8 = std::operator<<(poVar8,(string *)&exe);
    std::operator<<(poVar8,"\"");
  }
  std::__cxx11::string::~string((string *)&local_b8);
  pbVar3 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar9 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar9 + 1 != pbVar3) {
    std::operator<<(fout," \"");
    pcVar4 = pbVar9[1]._M_dataplus._M_p;
    sVar5 = pbVar9[1]._M_string_length;
    for (sVar10 = 0; sVar5 != sVar10; sVar10 = sVar10 + 1) {
      cVar1 = pcVar4[sVar10];
      if (cVar1 == '\"') {
        std::operator<<(fout,'\\');
      }
      std::operator<<(fout,cVar1);
    }
    std::operator<<(fout,'\"');
    pbVar9 = pbVar9 + 1;
  }
  std::operator<<(fout,")\n");
  if (bVar6) {
    poVar8 = operator<<(fout,(cmScriptGeneratorIndent)indent.Level);
    poVar8 = std::operator<<(poVar8,"set_tests_properties([");
    poVar8 = std::operator<<(poVar8,(string *)&equalSigns);
    poVar8 = std::operator<<(poVar8,"[");
    std::__cxx11::string::string((string *)&local_b8,(string *)&this->Test->Name);
    poVar8 = std::operator<<(poVar8,(string *)&local_b8);
    poVar8 = std::operator<<(poVar8,"]");
    poVar8 = std::operator<<(poVar8,(string *)&equalSigns);
    std::operator<<(poVar8,"] PROPERTIES ");
  }
  else {
    poVar8 = operator<<(fout,(cmScriptGeneratorIndent)indent.Level);
    poVar8 = std::operator<<(poVar8,"set_tests_properties(");
    std::__cxx11::string::string((string *)&local_b8,(string *)&this->Test->Name);
    poVar8 = std::operator<<(poVar8,(string *)&local_b8);
    std::operator<<(poVar8," PROPERTIES ");
  }
  std::__cxx11::string::~string((string *)&local_b8);
  cmPropertyMap::GetList_abi_cxx11_(&local_48,&this->Test->Properties);
  for (ppVar11 = local_48.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVar11 !=
      local_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVar11 = ppVar11 + 1) {
    poVar8 = std::operator<<(fout," ");
    poVar8 = std::operator<<(poVar8,(string *)ppVar11);
    poVar8 = std::operator<<(poVar8," ");
    str._M_str = (char *)0x0;
    str._M_len = (size_t)(ppVar11->second)._M_dataplus._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_b8,(cmOutputConverter *)(ppVar11->second)._M_string_length,str,in_R8D);
    std::operator<<(poVar8,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  GenerateInternalProperties(this,fout);
  std::operator<<(fout,")\n");
  std::__cxx11::string::~string((string *)&exe);
  std::__cxx11::string::~string((string *)&equalSigns);
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout, Indent indent)
{
  this->TestGenerated = true;

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  if (quote_test_name) {
    fout << indent << "add_test([" << equalSigns << "["
         << this->Test->GetName() << "]" << equalSigns << "] \"" << exe
         << "\"";
  } else {
    fout << indent << "add_test(" << this->Test->GetName() << " \"" << exe
         << "\"";
  }

  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for (char c : arg) {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if (c == '"') {
        fout << '\\';
      }
      fout << c;
    }
    fout << '"';
  }
  fout << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    fout << indent << "set_tests_properties([" << equalSigns << "["
         << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    fout << indent << "set_tests_properties(" << this->Test->GetName()
         << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    fout << " " << i.first << " "
         << cmOutputConverter::EscapeForCMake(i.second);
  }
  this->GenerateInternalProperties(fout);
  fout << ")\n";
}